

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O3

Curl_handler * Curl_builtin_scheme(char *scheme)

{
  int iVar1;
  Curl_handler *pCVar2;
  Curl_handler **ppCVar3;
  
  pCVar2 = &Curl_handler_http;
  ppCVar3 = protocols;
  do {
    ppCVar3 = ppCVar3 + 1;
    iVar1 = Curl_strcasecompare(pCVar2->scheme,scheme);
    if (iVar1 != 0) {
      return pCVar2;
    }
    pCVar2 = *ppCVar3;
  } while (pCVar2 != (Curl_handler *)0x0);
  return (Curl_handler *)0x0;
}

Assistant:

const struct Curl_handler *Curl_builtin_scheme(const char *scheme)
{
  const struct Curl_handler * const *pp;
  const struct Curl_handler *p;
  /* Scan protocol handler table and match against 'scheme'. The handler may
     be changed later when the protocol specific setup function is called. */
  for(pp = protocols; (p = *pp) != NULL; pp++)
    if(strcasecompare(p->scheme, scheme))
      /* Protocol found in table. Check if allowed */
      return p;
  return NULL; /* not found */
}